

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

bool __thiscall
duckdb::ToCStringCastWrapper<duckdb::CastFromBlob>::Operation<duckdb::string_t,duckdb_string>
          (ToCStringCastWrapper<duckdb::CastFromBlob> *this,string_t input,duckdb_string *result)

{
  void *__dest;
  char *__src;
  uint uVar1;
  ulong __n;
  string_t input_00;
  string_t result_string;
  Vector result_vector;
  anon_union_16_2_67f50693_for_value local_b8;
  LogicalType local_a8;
  Vector local_90;
  
  input_00.value._8_8_ = input.value._0_8_;
  LogicalType::LogicalType(&local_a8,VARCHAR);
  Vector::Vector(&local_90,&local_a8,(data_ptr_t)0x0);
  LogicalType::~LogicalType(&local_a8);
  input_00.value._0_8_ = this;
  local_b8.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       CastFromBlob::Operation<duckdb::string_t>(input_00,&local_90);
  __src = local_b8._8_8_;
  uVar1 = local_b8._0_4_;
  __n = local_b8._0_8_ & 0xffffffff;
  __dest = duckdb_malloc(__n + 1);
  if (uVar1 < 0xd) {
    __src = local_b8.pointer.prefix;
  }
  switchD_015de399::default(__dest,__src,__n);
  *(undefined1 *)((long)__dest + __n) = 0;
  *input.value._8_8_ = __dest;
  input.value._8_8_[1] = __n;
  if (local_90.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_90.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_90.type);
  return true;
}

Assistant:

static bool Operation(SOURCE_TYPE input, RESULT_TYPE &result) {
		Vector result_vector(LogicalType::VARCHAR, nullptr);
		auto result_string = OP::template Operation<SOURCE_TYPE>(input, result_vector);
		auto result_size = result_string.GetSize();
		auto result_data = result_string.GetData();

		char *allocated_data = char_ptr_cast(duckdb_malloc(result_size + 1));
		memcpy(allocated_data, result_data, result_size);
		allocated_data[result_size] = '\0';
		result.data = allocated_data;
		result.size = result_size;
		return true;
	}